

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_net.cpp
# Opt level: O0

void __thiscall FDynamicBuffer::SetData(FDynamicBuffer *this,BYTE *data,int len)

{
  BYTE *pBVar1;
  int len_local;
  BYTE *data_local;
  FDynamicBuffer *this_local;
  
  if (this->m_BufferLen < len) {
    this->m_BufferLen = len + 0xffU & 0xffffff00;
    pBVar1 = (BYTE *)M_Realloc_Dbg(this->m_Data,(long)this->m_BufferLen,
                                   "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/d_net.cpp"
                                   ,0x808);
    this->m_Data = pBVar1;
  }
  if (data == (BYTE *)0x0) {
    this->m_Len = 0;
  }
  else {
    this->m_Len = len;
    memcpy(this->m_Data,data,(long)len);
  }
  return;
}

Assistant:

void FDynamicBuffer::SetData (const BYTE *data, int len)
{
	if (len > m_BufferLen)
	{
		m_BufferLen = (len + 255) & ~255;
		m_Data = (BYTE *)M_Realloc (m_Data, m_BufferLen);
	}
	if (data != NULL)
	{
		m_Len = len;
		memcpy (m_Data, data, len);
	}
	else 
	{
		m_Len = 0;
	}
}